

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O1

void SL::WS_LITE::
     start_ping<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>
               (shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>_>
                *socket,seconds secs)

{
  element_type *peVar1;
  error_code ec;
  ostringstream buffersl134nonesd;
  error_code local_1c0;
  long *local_1b0;
  long local_1a8;
  long local_1a0 [2];
  type_conflict1 local_190 [4];
  ios_base local_120 [264];
  
  local_1c0._M_value = 0;
  local_1c0._M_cat = (error_category *)std::_V2::system_category();
  if (secs.__r == 0) {
    peVar1 = (socket->
             super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    asio::detail::
    deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
    ::cancel((peVar1->ping_deadline).
             super_basic_io_object<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_true>
             .service_,
             &(peVar1->ping_deadline).
              super_basic_io_object<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_true>
              .implementation_,&local_1c0);
  }
  peVar1 = (socket->
           super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  local_190[0].socket.
  super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)(secs.__r * 1000000000);
  asio::detail::
  deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  ::expires_from_now((peVar1->ping_deadline).
                     super_basic_io_object<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_true>
                     .service_,
                     &(peVar1->ping_deadline).
                      super_basic_io_object<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_true>
                      .implementation_,(duration_type *)local_190,&local_1c0);
  if (local_1c0._M_value == 0) {
    if (0 < secs.__r) {
      local_190[0].socket.
      super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (socket->
                super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr;
      local_190[0].socket.
      super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           (socket->
           super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
      if (local_190[0].socket.
          super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_190[0].socket.
           super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_190[0].socket.
                super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_190[0].socket.
           super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_190[0].socket.
                super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_190[0].secs.__r = secs.__r;
      asio::detail::
      deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
      ::
      async_wait<SL::WS_LITE::start_ping<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>(std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>const&,std::chrono::duration<long,std::ratio<1l,1l>>)::_lambda(std::error_code_const&)_1_>
                ((deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
                  *)((local_190[0].socket.
                      super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->ping_deadline).
                    super_basic_io_object<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_true>
                    .service_,
                 &((local_190[0].socket.
                    super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->ping_deadline).
                  super_basic_io_object<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_true>
                  .implementation_,local_190);
      if (local_190[0].socket.
          super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_190[0].socket.
                   super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    (**(code **)(*(long *)local_1c0._M_cat + 0x20))(&local_1b0,local_1c0._M_cat,local_1c0._M_value);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,(char *)local_1b0,local_1a8);
    if (local_1b0 != local_1a0) {
      operator_delete(local_1b0,local_1a0[0] + 1);
    }
    Log(ERROR_log_level,
        "/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/include/internal/WebSocketProtocol.h"
        ,0x3c,"start_ping",(ostringstream *)local_190);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
    std::ios_base::~ios_base(local_120);
  }
  return;
}

Assistant:

void start_ping(const SOCKETTYPE &socket, std::chrono::seconds secs)
    {
        std::error_code ec;
        if (secs.count() == 0)
            socket->ping_deadline.cancel(ec);
        socket->ping_deadline.expires_from_now(secs, ec);
        if (ec) {
            SL_WS_LITE_LOG(Logging_Levels::ERROR_log_level, ec.message());
        }
        else if (secs.count() > 0) {
            socket->ping_deadline.async_wait([socket, secs](const std::error_code &ec) {
                if (ec != asio::error::operation_aborted) {
                    WSMessage msg;
                    char p[] = "ping";
                    msg.Buffer = std::shared_ptr<unsigned char>(new unsigned char[sizeof(p)], [](unsigned char *ptr) { delete[] ptr; });
                    memcpy(msg.Buffer.get(), p, sizeof(p));
                    msg.len = sizeof(p);
                    msg.code = OpCode::PING;
                    msg.data = msg.Buffer.get();
                    sendImpl<isServer>(socket, msg, CompressionOptions::NO_COMPRESSION);
                    start_ping<isServer>(socket, secs);
                }
            });
        }
    }